

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int CustomPut(VP8Io *io)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  int num_lines_out;
  int mb_h;
  int mb_w;
  WebPDecParams *p;
  undefined4 local_4;
  
  lVar1 = *(long *)(in_RDI + 0x38);
  if ((*(int *)(in_RDI + 0xc) < 1) || (*(int *)(in_RDI + 0x10) < 1)) {
    local_4 = 0;
  }
  else {
    iVar2 = (**(code **)(lVar1 + 0x58))(in_RDI,lVar1);
    if (*(long *)(lVar1 + 0x60) != 0) {
      (**(code **)(lVar1 + 0x60))(in_RDI,lVar1,iVar2);
    }
    *(int *)(lVar1 + 0x20) = iVar2 + *(int *)(lVar1 + 0x20);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int CustomPut(const VP8Io* io) {
  WebPDecParams* const p = (WebPDecParams*)io->opaque;
  const int mb_w = io->mb_w;
  const int mb_h = io->mb_h;
  int num_lines_out;
  assert(!(io->mb_y & 1));

  if (mb_w <= 0 || mb_h <= 0) {
    return 0;
  }
  num_lines_out = p->emit(io, p);
  if (p->emit_alpha != NULL) {
    p->emit_alpha(io, p, num_lines_out);
  }
  p->last_y += num_lines_out;
  return 1;
}